

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

QSize __thiscall QToolBarAreaLayoutLine::minimumSize(QToolBarAreaLayoutLine *this)

{
  bool bVar1;
  QSize QVar2;
  Representation RVar3;
  int iVar4;
  Representation RVar5;
  long lVar6;
  int i;
  ulong uVar7;
  QToolBarAreaLayoutItem *this_00;
  int iVar8;
  
  lVar6 = 0;
  iVar4 = 0;
  iVar8 = 0;
  for (uVar7 = 0; uVar7 < (ulong)(this->toolBarItems).d.size; uVar7 = uVar7 + 1) {
    this_00 = (QToolBarAreaLayoutItem *)((long)&((this->toolBarItems).d.ptr)->widgetItem + lVar6);
    bVar1 = QToolBarAreaLayoutItem::skip(this_00);
    RVar5.m_i = iVar4;
    if (!bVar1) {
      QVar2 = QToolBarAreaLayoutItem::minimumSize(this_00);
      RVar5.m_i = QVar2.ht.m_i.m_i;
      if (this->o == Horizontal) {
        RVar5.m_i = QVar2.wd.m_i.m_i;
      }
      iVar8 = iVar8 + RVar5.m_i;
      RVar5.m_i = QVar2.ht.m_i.m_i;
      if (this->o == Vertical) {
        RVar5.m_i = QVar2.wd.m_i.m_i;
      }
      if (RVar5.m_i < iVar4) {
        RVar5.m_i = iVar4;
      }
    }
    iVar4 = RVar5.m_i;
    lVar6 = lVar6 + 0x18;
  }
  RVar5.m_i = iVar8;
  RVar3.m_i = iVar4;
  if ((this->o != Horizontal) && (RVar5.m_i = iVar4, RVar3.m_i = iVar8, this->o != Vertical)) {
    RVar5.m_i = -1;
    RVar3.m_i = iVar4;
  }
  QVar2.ht.m_i = RVar3.m_i;
  QVar2.wd.m_i = RVar5.m_i;
  return QVar2;
}

Assistant:

QSize QToolBarAreaLayoutLine::minimumSize() const
{
    int a = 0, b = 0;
    for (int i = 0; i < toolBarItems.size(); ++i) {
        const QToolBarAreaLayoutItem &item = toolBarItems[i];
        if (item.skip())
            continue;

        QSize ms = item.minimumSize();
        a += pick(o, ms);
        b = qMax(b, perp(o, ms));
    }

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

    return result;
}